

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::DeepTiledInputFile::getTileOrder(DeepTiledInputFile *this,int *dx,int *dy,int *lx,int *ly)

{
  int iVar1;
  exr_tile_level_mode_t eVar2;
  element_type *peVar3;
  ulong uVar4;
  ulong *puVar5;
  exr_lineorder_t eVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong *puVar12;
  ulong uVar13;
  long lVar14;
  int *piVar15;
  ArgExc *pAVar16;
  int iVar17;
  __normal_iterator<Imf_3_4::(anonymous_namespace)::tilepos_*,_std::vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>_>
  __i;
  ulong *puVar18;
  ulong *puVar19;
  int iVar20;
  value_type *__val;
  bool bVar21;
  exr_chunk_info_t cinfo;
  long local_c0;
  ulong local_b8;
  ulong local_78;
  ulong uStack_70;
  undefined8 local_60;
  
  eVar6 = Context::lineOrder(&this->_ctxt,
                             ((this->_data).
                              super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->partNumber);
  if (eVar6 == EXR_LINEORDER_INCREASING_Y) {
    *dx = 0;
    *dy = 0;
    *lx = 0;
    *ly = 0;
    return;
  }
  if (eVar6 != EXR_LINEORDER_RANDOM_Y) {
    if (eVar6 == EXR_LINEORDER_DECREASING_Y) {
      *dx = 0;
      iVar7 = numYTiles(this,0);
      *dy = iVar7 + -1;
      *lx = 0;
      *ly = 0;
      return;
    }
    pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar16,"Unknown LineOrder.");
LAB_0016fecf:
    __cxa_throw(pAVar16,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  peVar3 = (this->_data).
           super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar7 = peVar3->num_x_levels;
  iVar1 = peVar3->num_y_levels;
  if (peVar3->tile_level_mode < EXR_TILE_RIPMAP_LEVELS) {
    iVar20 = 0;
    if (0 < iVar1) {
      local_b8 = 0;
      do {
        iVar8 = numXTiles(this,iVar20);
        iVar9 = numYTiles(this,iVar20);
        local_b8 = local_b8 + (long)iVar9 * (long)iVar8;
        iVar20 = iVar20 + 1;
      } while (iVar1 != iVar20);
LAB_0016fa0e:
      bVar21 = local_b8 == 0;
      if (!bVar21) {
        if (0x555555555555555 < local_b8) {
          std::__throw_length_error("vector::_M_default_append");
        }
        puVar12 = (ulong *)operator_new(local_b8 * 0x18);
        *puVar12 = 0;
        puVar12[1] = 0;
        puVar12[2] = 0;
        if (local_b8 != 1) {
          uVar13 = 0x18;
          do {
            *(ulong *)((long)puVar12 + uVar13 + 0x10) = puVar12[2];
            uVar4 = puVar12[1];
            *(ulong *)((long)puVar12 + uVar13) = *puVar12;
            ((ulong *)((long)puVar12 + uVar13))[1] = uVar4;
            uVar13 = uVar13 + 0x18;
          } while (local_b8 * 0x18 != uVar13);
        }
        puVar19 = puVar12 + local_b8 * 3;
        goto LAB_0016fab6;
      }
    }
  }
  else {
    if (peVar3->tile_level_mode != EXR_TILE_RIPMAP_LEVELS) {
      pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar16,"Unknown LevelMode format.");
      goto LAB_0016fecf;
    }
    iVar20 = 0;
    if (0 < iVar1) {
      local_b8 = 0;
      do {
        if (0 < iVar7) {
          iVar8 = 0;
          do {
            iVar9 = numXTiles(this,iVar8);
            iVar10 = numYTiles(this,iVar20);
            local_b8 = local_b8 + (long)iVar10 * (long)iVar9;
            iVar8 = iVar8 + 1;
          } while (iVar7 != iVar8);
        }
        iVar20 = iVar20 + 1;
      } while (iVar20 != iVar1);
      goto LAB_0016fa0e;
    }
  }
  local_b8 = 0;
  bVar21 = true;
  puVar12 = (ulong *)0x0;
  puVar19 = (ulong *)0x0;
LAB_0016fab6:
  eVar2 = ((this->_data).
           super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->tile_level_mode;
  if (eVar2 < EXR_TILE_RIPMAP_LEVELS) {
    if (0 < iVar1) {
      lVar14 = 0;
      iVar7 = 0;
      do {
        iVar20 = numYTiles(this,iVar7);
        iVar8 = numXTiles(this,iVar7);
        if (0 < iVar20) {
          iVar9 = 0;
          do {
            if (0 < iVar8) {
              piVar15 = (int *)((long)puVar12 + lVar14 * 0x18 + 0x14);
              uVar13 = 0;
              do {
                iVar10 = exr_read_tile_chunk_info
                                   (*(this->_ctxt)._ctxt.
                                     super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,((this->_data).
                                              super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr)->partNumber,uVar13 & 0xffffffff,iVar9,iVar7,
                                    iVar7,&local_78);
                if (iVar10 != 0) {
                  pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
                  Iex_3_4::ArgExc::ArgExc(pAVar16,"Unable to get tile offset.");
                  __cxa_throw(pAVar16,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
                }
                *(undefined8 *)(piVar15 + -5) = local_60;
                piVar15[-3] = (int)uVar13;
                piVar15[-2] = iVar9;
                piVar15[-1] = iVar7;
                *piVar15 = iVar7;
                uVar13 = uVar13 + 1;
                piVar15 = piVar15 + 6;
              } while (iVar8 != (int)uVar13);
              lVar14 = lVar14 + uVar13;
            }
            iVar9 = iVar9 + 1;
          } while (iVar9 != iVar20);
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 != iVar1);
    }
  }
  else {
    if (eVar2 != EXR_TILE_RIPMAP_LEVELS) {
      pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar16,"Unknown LevelMode format.");
      __cxa_throw(pAVar16,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    if (0 < iVar1) {
      iVar20 = 0;
      local_c0 = 0;
      do {
        iVar8 = numYTiles(this,iVar20);
        if (0 < iVar7) {
          iVar9 = 0;
          do {
            iVar10 = numXTiles(this,iVar9);
            if (0 < iVar8) {
              iVar17 = 0;
              do {
                if (0 < iVar10) {
                  piVar15 = (int *)((long)puVar12 + local_c0 * 0x18 + 0x14);
                  uVar13 = 0;
                  do {
                    iVar11 = exr_read_tile_chunk_info
                                       (*(this->_ctxt)._ctxt.
                                         super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr,((this->_data).
                                                  super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr)->partNumber,uVar13 & 0xffffffff,iVar17,
                                        iVar9,iVar20,&local_78);
                    if (iVar11 != 0) {
                      pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
                      Iex_3_4::ArgExc::ArgExc(pAVar16,"Unable to get tile offset.");
                      __cxa_throw(pAVar16,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
                    }
                    *(undefined8 *)(piVar15 + -5) = local_60;
                    piVar15[-3] = (int)uVar13;
                    piVar15[-2] = iVar17;
                    piVar15[-1] = iVar9;
                    *piVar15 = iVar20;
                    uVar13 = uVar13 + 1;
                    piVar15 = piVar15 + 6;
                  } while (iVar10 != (int)uVar13);
                  local_c0 = local_c0 + uVar13;
                }
                iVar17 = iVar17 + 1;
              } while (iVar17 != iVar8);
            }
            iVar9 = iVar9 + 1;
          } while (iVar9 != iVar7);
        }
        iVar20 = iVar20 + 1;
      } while (iVar20 != iVar1);
    }
  }
  if (puVar12 != puVar19) {
    uVar13 = ((long)puVar19 - (long)puVar12 >> 3) * -0x5555555555555555;
    lVar14 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Imf_3_4::(anonymous_namespace)::tilepos*,std::vector<Imf_3_4::(anonymous_namespace)::tilepos,std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar12,puVar19,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)puVar19 - (long)puVar12 < 0x181) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Imf_3_4::(anonymous_namespace)::tilepos*,std::vector<Imf_3_4::(anonymous_namespace)::tilepos,std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar12,puVar19);
    }
    else {
      puVar18 = puVar12 + 0x30;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Imf_3_4::(anonymous_namespace)::tilepos*,std::vector<Imf_3_4::(anonymous_namespace)::tilepos,std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar12,puVar18);
      for (; puVar18 != puVar19; puVar18 = puVar18 + 3) {
        uVar13 = *puVar18;
        local_78 = puVar18[1];
        uStack_70 = puVar18[2];
        uVar4 = puVar18[-3];
        puVar5 = puVar18;
        while (uVar13 < uVar4) {
          puVar5[2] = puVar5[-1];
          *puVar5 = puVar5[-3];
          puVar5[1] = puVar5[-2];
          uVar4 = puVar5[-6];
          puVar5 = puVar5 + -3;
        }
        *puVar5 = uVar13;
        puVar5[1] = local_78;
        puVar5[2] = uStack_70;
      }
    }
  }
  if (bVar21) {
    if (puVar12 == (ulong *)0x0) {
      return;
    }
  }
  else {
    piVar15 = (int *)((long)puVar12 + 0x14);
    uVar13 = 0;
    do {
      dx[uVar13] = piVar15[-3];
      dy[uVar13] = piVar15[-2];
      lx[uVar13] = piVar15[-1];
      ly[uVar13] = *piVar15;
      uVar13 = uVar13 + 1;
      piVar15 = piVar15 + 6;
    } while (local_b8 != uVar13);
  }
  operator_delete(puVar12,(long)puVar19 - (long)puVar12);
  return;
}

Assistant:

void
DeepTiledInputFile::getTileOrder (int dx[], int dy[], int lx[], int ly[]) const
{
    // TODO: remove once TiledOutputFile copy is converted
    switch (_ctxt.lineOrder (_data->partNumber))
    {
        case EXR_LINEORDER_RANDOM_Y:
            // calc below outside the nest
            break;

        case EXR_LINEORDER_DECREASING_Y:
        {
            dx[0] = 0;
            dy[0] = numYTiles (0) - 1;
            lx[0] = 0;
            ly[0] = 0;
            return;
        }
        case EXR_LINEORDER_INCREASING_Y:
            dx[0] = 0;
            dy[0] = 0;
            lx[0] = 0;
            ly[0] = 0;
            return;

        case EXR_LINEORDER_LAST_TYPE: /* invalid but should never be here */
        default:
            throw IEX_NAMESPACE::ArgExc ("Unknown LineOrder.");
    }

    size_t numAllTiles = 0;
    int numX = numXLevels ();
    int numY = numYLevels ();

    switch (levelMode ())
    {
        case ONE_LEVEL:
        case MIPMAP_LEVELS:
            for (int i_l = 0; i_l < numY; ++i_l)
                numAllTiles += size_t (numXTiles (i_l)) * size_t (numYTiles (i_l));
            break;

        case RIPMAP_LEVELS:
            for (int i_ly = 0; i_ly < numY; ++i_ly)
                for (int i_lx = 0; i_lx < numX; ++i_lx)
                    numAllTiles += size_t (numXTiles (i_lx)) * size_t (numYTiles (i_ly));
            break;

        default:
            throw IEX_NAMESPACE::ArgExc ("Unknown LevelMode format.");
    }

    std::vector<tilepos> table;

    table.resize (numAllTiles);
    size_t tIdx = 0;
    switch (levelMode ())
    {
        case ONE_LEVEL:
        case MIPMAP_LEVELS:
            for (int i_l = 0; i_l < numY; ++i_l)
            {
                int nY = numYTiles (i_l);
                int nX = numXTiles (i_l);

                for ( int y = 0; y < nY; ++y )
                    for ( int x = 0; x < nX; ++x )
                    {
                        exr_chunk_info_t cinfo;
                        if (EXR_ERR_SUCCESS == exr_read_tile_chunk_info (
                                _ctxt, _data->partNumber, x, y, i_l, i_l, &cinfo))
                        {
                            tilepos &tp = table[tIdx++];
                            tp.filePos = cinfo.data_offset;
                            tp.dx = x;
                            tp.dy = y;
                            tp.lx = i_l;
                            tp.ly = i_l;
                        }
                        else
                        {
                            throw IEX_NAMESPACE::ArgExc ("Unable to get tile offset.");
                        }
                    }
            }
            break;

        case RIPMAP_LEVELS:
            for (int i_ly = 0; i_ly < numY; ++i_ly)
            {
                int nY = numYTiles (i_ly);
                for (int i_lx = 0; i_lx < numX; ++i_lx)
                {
                    int nX = numXTiles (i_lx);
                    for ( int y = 0; y < nY; ++y )
                        for ( int x = 0; x < nX; ++x )
                        {
                            exr_chunk_info_t cinfo;
                            if (EXR_ERR_SUCCESS == exr_read_tile_chunk_info (
                                    _ctxt, _data->partNumber, x, y, i_lx, i_ly, &cinfo))
                            {
                                tilepos &tp = table[tIdx++];
                                tp.filePos = cinfo.data_offset;
                                tp.dx = x;
                                tp.dy = y;
                                tp.lx = i_lx;
                                tp.ly = i_ly;
                            }
                            else
                            {
                                throw IEX_NAMESPACE::ArgExc ("Unable to get tile offset.");
                            }
                        }
                }
            }
            break;

        default: throw IEX_NAMESPACE::ArgExc ("Unknown LevelMode format.");
    }

    std::sort (table.begin(), table.end ());

    for (size_t i = 0; i < numAllTiles; ++i)
    {
        const auto& tp = table[i];
        dx[i] = tp.dx;
        dy[i] = tp.dy;
        lx[i] = tp.lx;
        ly[i] = tp.ly;
    }
}